

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O1

fct_logger_i * fct_standard_logger_new(void)

{
  fct_logger_i *pfVar1;
  long lVar2;
  fct_logger_i_vtable_t *pfVar3;
  fct_logger_i *pfVar4;
  byte bVar5;
  
  bVar5 = 0;
  pfVar1 = (fct_logger_i *)calloc(1,0xc0);
  if (pfVar1 == (fct_logger_i *)0x0) {
    pfVar1 = (fct_logger_i *)0x0;
  }
  else {
    pfVar3 = &fct_logger_default_vtable;
    pfVar4 = pfVar1;
    for (lVar2 = 0xb; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pfVar4->vtable).on_chk = pfVar3->on_chk;
      pfVar3 = (fct_logger_i_vtable_t *)((long)pfVar3 + ((ulong)bVar5 * -2 + 1) * 8);
      pfVar4 = (fct_logger_i *)((long)pfVar4 + (ulong)bVar5 * -0x10 + 8);
    }
    (pfVar1->evt).msg = (char *)0x0;
    (pfVar1->evt).cndtn = (char *)0x0;
    (pfVar1->evt).test = (fct_test_t *)0x0;
    (pfVar1->evt).ts = (fct_ts_t *)0x0;
    (pfVar1->evt).kern = (fctkern_t *)0x0;
    (pfVar1->evt).chk = (fctchk_t *)0x0;
    (pfVar1->evt).name = (char *)0x0;
    (pfVar1->vtable).on_chk = fct_standard_logger__on_chk;
    (pfVar1->vtable).on_test_start = fct_standard_logger__on_test_start;
    (pfVar1->vtable).on_test_end = fct_standard_logger__on_test_end;
    (pfVar1->vtable).on_fctx_start = fct_standard_logger__on_fctx_start;
    (pfVar1->vtable).on_fctx_end = fct_standard_logger__on_fctx_end;
    (pfVar1->vtable).on_delete = fct_standard_logger__on_delete;
    (pfVar1->vtable).on_warn = fct_standard_logger__on_warn;
    (pfVar1->vtable).on_test_skip = fct_standard_logger__on_test_skip;
    pfVar1[1].vtable.on_chk = (_func_void_fct_logger_i_ptr_fct_logger_evt_t_ptr *)0x0;
    pfVar1[1].vtable.on_test_start = (_func_void_fct_logger_i_ptr_fct_logger_evt_t_ptr *)0x0;
    pfVar1[1].vtable.on_test_end = (_func_void_fct_logger_i_ptr_fct_logger_evt_t_ptr *)0x0;
    pfVar1[1].vtable.on_test_suite_start = (_func_void_fct_logger_i_ptr_fct_logger_evt_t_ptr *)0x0;
    pfVar1[1].vtable.on_test_suite_end = (_func_void_fct_logger_i_ptr_fct_logger_evt_t_ptr *)0x0;
    pfVar1[1].vtable.on_fctx_start = (_func_void_fct_logger_i_ptr_fct_logger_evt_t_ptr *)0x0;
  }
  return pfVar1;
}

Assistant:

fct_logger_i*
fct_standard_logger_new(void)
{
    fct_standard_logger_t *logger = (fct_standard_logger_t *)calloc(
                                        1, sizeof(fct_standard_logger_t)
                                    );
    if ( logger == NULL )
    {
        return NULL;
    }
    fct_logger__init((fct_logger_i*)logger);
    logger->vtable.on_chk = fct_standard_logger__on_chk;
    logger->vtable.on_test_start = fct_standard_logger__on_test_start;
    logger->vtable.on_test_end = fct_standard_logger__on_test_end;
    logger->vtable.on_fctx_start = fct_standard_logger__on_fctx_start;
    logger->vtable.on_fctx_end = fct_standard_logger__on_fctx_end;
    logger->vtable.on_delete = fct_standard_logger__on_delete;
    logger->vtable.on_warn = fct_standard_logger__on_warn;
    logger->vtable.on_test_skip = fct_standard_logger__on_test_skip;
    fct_nlist__init2(&(logger->failed_cndtns_list), 0);
    fct_timer__init(&(logger->timer));
    return (fct_logger_i*)logger;
}